

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O0

sexp_conflict sexp_bit_count(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict x)

{
  undefined1 auVar1 [16];
  sexp_uint_t sVar2;
  int *in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sexp_uint_t count;
  sexp_sint_t i;
  sexp_conflict res;
  sexp_uint_t local_40;
  long local_38;
  long local_30;
  sexp_conflict local_28;
  
  if (((ulong)in_RCX & 1) == 1) {
    auVar1._8_8_ = (long)in_RCX >> 0x3f;
    auVar1._0_8_ = (ulong)in_RCX & 0xfffffffffffffffe;
    local_40 = SUB168(auVar1 / SEXT816(2),0);
    if ((long)local_40 < 0) {
      local_40 = local_40 ^ 0xffffffffffffffff;
    }
    sVar2 = bit_count(local_40);
    local_28 = (sexp_conflict)(sVar2 << 1 | 1);
  }
  else if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0xc)) {
    local_38 = 0;
    for (local_30 = 0; local_30 < *(long *)(in_RCX + 4); local_30 = local_30 + 1) {
      sVar2 = bit_count(*(sexp_uint_t *)(in_RCX + local_30 * 2 + 6));
      local_38 = sVar2 + local_38;
    }
    local_28 = (sexp_conflict)(local_38 << 1 | 1);
  }
  else {
    local_28 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_RCX);
  }
  return local_28;
}

Assistant:

sexp sexp_bit_count (sexp ctx, sexp self, sexp_sint_t n, sexp x) {
  sexp res;
  sexp_sint_t i;
#if SEXP_USE_BIGNUMS
  sexp_uint_t count;
#endif
  if (sexp_fixnump(x)) {
    i = sexp_unbox_fixnum(x);
    res = sexp_make_fixnum(bit_count(i<0 ? ~i : i));
#if SEXP_USE_BIGNUMS
  } else if (sexp_bignump(x)) {
    for (i=count=0; i<(sexp_sint_t)sexp_bignum_length(x); i++)
      count += bit_count(sexp_bignum_data(x)[i]);
    res = sexp_make_fixnum(count);
#endif
  } else {
    res = sexp_type_exception(ctx, self, SEXP_FIXNUM, x);
  }
  return res;
}